

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionCornerCaseHelper<short,_unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase1
               (unsigned_long lhs,
               SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  bool bVar1;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_22;
  ulong local_20;
  
  if (rhs.m_int < 1) {
    if (rhs.m_int == 0) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<short,_unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
            ::NegativeCornerCase(lhs,rhs,result);
    if (bVar1) {
      return true;
    }
    local_20 = (ulong)((ulong)(long)rhs.m_int <= lhs);
  }
  else {
    local_20 = lhs / (ushort)rhs.m_int;
  }
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>(&local_22,&local_20);
  result->m_int = (short)local_22;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }